

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuerySegment.hpp
# Opt level: O0

void __thiscall
cppjieba::QuerySegment::Cut
          (QuerySegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res,bool hmm)

{
  const_iterator pRVar1;
  Rune *pRVar2;
  bool bVar3;
  pointer pWVar4;
  size_t sVar5;
  undefined1 *puVar6;
  DictUnit *pDVar7;
  reference __x;
  undefined1 local_b8 [8];
  WordRange wr_1;
  size_t i_1;
  WordRange wr;
  size_t i;
  __normal_iterator<cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
  local_80;
  __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
  local_78;
  const_iterator mixResItr;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> fullRes;
  undefined1 local_48 [8];
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> mixRes;
  bool hmm_local;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res_local;
  const_iterator end_local;
  const_iterator begin_local;
  QuerySegment *this_local;
  
  mixRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = hmm;
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::vector
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_48);
  MixSegment::Cut(&this->mixSeg_,begin,end,
                  (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_48,
                  (bool)(mixRes.
                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::vector
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)&mixResItr);
  local_80._M_current =
       (WordRange *)
       std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::begin
                 ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_48);
  __gnu_cxx::
  __normal_iterator<cppjieba::WordRange_const*,std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>>
  ::__normal_iterator<cppjieba::WordRange*>
            ((__normal_iterator<cppjieba::WordRange_const*,std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>>
              *)&local_78,&local_80);
  while( true ) {
    i = (size_t)std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::end
                          ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                           local_48);
    bVar3 = __gnu_cxx::operator!=
                      (&local_78,
                       (__normal_iterator<cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                        *)&i);
    if (!bVar3) break;
    pWVar4 = __gnu_cxx::
             __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
             ::operator->(&local_78);
    sVar5 = WordRange::Length(pWVar4);
    if (2 < sVar5) {
      wr.right = (const_iterator)0x0;
      while( true ) {
        pRVar2 = &(wr.right)->rune;
        pWVar4 = __gnu_cxx::
                 __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 ::operator->(&local_78);
        puVar6 = (undefined1 *)WordRange::Length(pWVar4);
        if (puVar6 <= (undefined1 *)((long)pRVar2 + 1U)) break;
        pWVar4 = __gnu_cxx::
                 __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 ::operator->(&local_78);
        pRVar1 = pWVar4->left + (long)wr.right;
        pWVar4 = __gnu_cxx::
                 __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 ::operator->(&local_78);
        WordRange::WordRange
                  ((WordRange *)&i_1,pRVar1,pWVar4->left + (long)((long)&(wr.right)->rune + 1));
        pDVar7 = DictTrie::Find(this->trie_,(const_iterator)i_1,wr.left + 1);
        if (pDVar7 != (DictUnit *)0x0) {
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                    (res,(value_type *)&i_1);
        }
        wr.right = (const_iterator)((long)&(wr.right)->rune + 1);
      }
    }
    pWVar4 = __gnu_cxx::
             __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
             ::operator->(&local_78);
    sVar5 = WordRange::Length(pWVar4);
    if (3 < sVar5) {
      wr_1.right = (const_iterator)0x0;
      while( true ) {
        pRVar2 = &(wr_1.right)->rune;
        pWVar4 = __gnu_cxx::
                 __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 ::operator->(&local_78);
        puVar6 = (undefined1 *)WordRange::Length(pWVar4);
        if (puVar6 <= (undefined1 *)((long)pRVar2 + 2U)) break;
        pWVar4 = __gnu_cxx::
                 __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 ::operator->(&local_78);
        pRVar1 = pWVar4->left + (long)wr_1.right;
        pWVar4 = __gnu_cxx::
                 __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 ::operator->(&local_78);
        WordRange::WordRange
                  ((WordRange *)local_b8,pRVar1,pWVar4->left + (long)((long)&(wr_1.right)->rune + 2)
                  );
        pDVar7 = DictTrie::Find(this->trie_,(const_iterator)local_b8,wr_1.left + 1);
        if (pDVar7 != (DictUnit *)0x0) {
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                    (res,(value_type *)local_b8);
        }
        wr_1.right = (const_iterator)((long)&(wr_1.right)->rune + 1);
      }
    }
    __x = __gnu_cxx::
          __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
          ::operator*(&local_78);
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back(res,__x);
    __gnu_cxx::
    __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
    ::operator++(&local_78,0);
  }
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~vector
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)&mixResItr);
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~vector
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_48);
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res, bool hmm) const {
    //use mix Cut first
    vector<WordRange> mixRes;
    mixSeg_.Cut(begin, end, mixRes, hmm);

    vector<WordRange> fullRes;
    for (vector<WordRange>::const_iterator mixResItr = mixRes.begin(); mixResItr != mixRes.end(); mixResItr++) {
      if (mixResItr->Length() > 2) {
        for (size_t i = 0; i + 1 < mixResItr->Length(); i++) {
          WordRange wr(mixResItr->left + i, mixResItr->left + i + 1);
          if (trie_->Find(wr.left, wr.right + 1) != NULL) {
            res.push_back(wr);
          }
        }
      }
      if (mixResItr->Length() > 3) {
        for (size_t i = 0; i + 2 < mixResItr->Length(); i++) {
          WordRange wr(mixResItr->left + i, mixResItr->left + i + 2);
          if (trie_->Find(wr.left, wr.right + 1) != NULL) {
            res.push_back(wr);
          }
        }
      }
      res.push_back(*mixResItr);
    }
  }